

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O1

void Gia_ManSimRelPrint(Gia_Man_t *p,Vec_Wrd_t *vRel,Vec_Int_t *vOutMints)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint local_40;
  
  iVar2 = p->vSimsPi->nSize / p->vCis->nSize;
  iVar1 = vRel->nSize / iVar2;
  if (0 < iVar2) {
    iVar3 = 1;
    if (1 < iVar2 * 0x40) {
      iVar3 = iVar2 * 0x40;
    }
    local_40 = 0;
    iVar2 = 0;
    do {
      uVar5 = 0;
      if (0 < iVar1) {
        uVar5 = 0;
        iVar6 = iVar1;
        uVar4 = local_40;
        do {
          printf("%d",(ulong)((vRel->pArray[uVar4 >> 6] >> ((ulong)uVar4 & 0x3f) & 1) != 0));
          uVar5 = uVar5 + ((vRel->pArray[uVar4 >> 6] >> ((ulong)uVar4 & 0x3f) & 1) != 0);
          uVar4 = uVar4 + 1;
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      printf("  Count = %2d \n",(ulong)uVar5);
      iVar2 = iVar2 + 1;
      local_40 = local_40 + iVar1;
    } while (iVar2 != iVar3);
  }
  return;
}

Assistant:

void Gia_ManSimRelPrint( Gia_Man_t * p, Vec_Wrd_t * vRel, Vec_Int_t * vOutMints )
{
    int nWords = Vec_WrdSize(p->vSimsPi) / Gia_ManCiNum(p);
    int nMints = Vec_WrdSize(vRel) / nWords; 
    int i, m, Count;
/*
    for ( i = 0; i < 64 * nWords; i++ )
    {
        int k;
        for ( k = 0; k < Gia_ManCiNum(p); k++ )
            printf( "%d", Abc_TtGetBit( Vec_WrdEntryP(p->vSimsPi, k), i ) );
        printf( " " );
        Count = 0;
        for ( m = 0; m < nMints; m++ )
        {
            printf( "%d", Abc_TtGetBit( Vec_WrdArray(vRel), i*nMints+m ) );
            Count += Abc_TtGetBit( Vec_WrdArray(vRel), i*nMints+m );
        }
        printf( "  Count = %2d ", Count );
        if ( vOutMints )
        {
            printf( "   %3d ", Vec_IntEntry(vOutMints, i) );
            if ( Abc_TtGetBit( Vec_WrdArray(vRel), i*nMints+Vec_IntEntry(vOutMints, i) ) )
                printf( "yes" );
            else
                printf( "no" );
        }
        printf( "\n" );
    }
*/
/*
    for ( i = 0; i < 64 * nWords; i++ )
    {
        Count = 0;
        for ( m = 0; m < nMints; m++ )
            Count += Abc_TtGetBit( Vec_WrdArray(vRel), i*nMints+m );
        printf( "%d ", Count );
    }
    printf( "\n" );
*/
    for ( i = 0; i < 64 * nWords; i++ )
    {
        Count = 0;
        for ( m = 0; m < nMints; m++ )
        {
            printf( "%d", Abc_TtGetBit( Vec_WrdArray(vRel), i*nMints+m ) );
            Count += Abc_TtGetBit( Vec_WrdArray(vRel), i*nMints+m );
        }
        printf( "  Count = %2d \n", Count );
    }
}